

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_proxy_module.c
# Opt level: O2

void ngx_stream_proxy_process(ngx_stream_session_t *s,ngx_uint_t from_upstream,ngx_uint_t do_write)

{
  undefined1 *puVar1;
  uint uVar2;
  ngx_connection_t *pnVar3;
  ngx_stream_upstream_t *pnVar4;
  void *pvVar5;
  ulong uVar6;
  ngx_stream_upstream_state_t *pnVar7;
  u_char *puVar8;
  ngx_buf_t *pnVar9;
  ngx_log_handler_pt p_Var10;
  bool bVar11;
  ngx_chain_t **ppnVar12;
  ulong *puVar13;
  ngx_int_t nVar14;
  ssize_t sVar15;
  ngx_chain_t **ppnVar16;
  ngx_chain_t *pnVar17;
  size_t sVar18;
  ngx_connection_t *pnVar19;
  ngx_connection_t *pnVar20;
  ngx_uint_t nVar21;
  ngx_log_t *pnVar22;
  size_t sVar23;
  char *pcVar24;
  char *pcVar25;
  long lVar26;
  ngx_chain_t **busy;
  long lVar27;
  ngx_chain_t **out;
  off_t oVar28;
  off_t *local_70;
  ngx_buf_t *local_58;
  ngx_connection_t *local_40;
  
  pnVar3 = s->connection;
  pnVar4 = s->upstream;
  if ((pnVar4->field_0x178 & 1) == 0) {
    pnVar19 = (ngx_connection_t *)0x0;
  }
  else {
    pnVar19 = (pnVar4->peer).connection;
  }
  if ((pnVar3->type != 2) || ((ngx_terminate == 0 && (ngx_exiting == 0)))) {
    pvVar5 = s->srv_conf[ngx_stream_proxy_module.ctx_index];
    if (from_upstream == 0) {
      local_58 = &pnVar4->downstream_buf;
      puVar13 = (ulong *)((long)pvVar5 + 0x20);
      local_70 = &s->received;
      lVar26 = 0x120;
      lVar27 = 0x118;
      pnVar20 = pnVar19;
      local_40 = pnVar3;
    }
    else {
      local_58 = &pnVar4->upstream_buf;
      puVar13 = (ulong *)((long)pvVar5 + 0x28);
      local_70 = &pnVar4->received;
      lVar26 = 0x130;
      lVar27 = 0x128;
      pnVar20 = pnVar3;
      local_40 = pnVar19;
    }
    out = (ngx_chain_t **)((long)&(pnVar4->peer).connection + lVar27);
    busy = (ngx_chain_t **)((long)&(pnVar4->peer).connection + lVar26);
    uVar6 = *puVar13;
    bVar11 = do_write != 0 && pnVar20 != (ngx_connection_t *)0x0;
    do {
      if ((bVar11) &&
         (((*out != (ngx_chain_t *)0x0 || (*busy != (ngx_chain_t *)0x0)) ||
          (pnVar20->field_0xd8 != '\0')))) {
        nVar14 = (*ngx_stream_top_filter)(s,*out,from_upstream);
        if (nVar14 == -1) {
          if ((from_upstream == 0) && (pnVar3->type == 2)) goto LAB_00187fc5;
          nVar21 = 200;
          goto LAB_00188028;
        }
        ngx_chain_update_chains(pnVar3->pool,&pnVar4->free,busy,out,&ngx_stream_proxy_module);
        if (*busy == (ngx_chain_t *)0x0) {
          local_58->pos = local_58->start;
          local_58->last = local_58->start;
        }
      }
      sVar18 = (long)local_58->end - (long)local_58->last;
      if (sVar18 == 0) {
LAB_00187e61:
        uVar2 = *(uint *)&local_40->read->field_0x8;
        if ((((uVar2 >> 8 & 1) == 0) || (pnVar20 == (ngx_connection_t *)0x0)) ||
           (((pnVar20->read->field_0x9 & 1) == 0 && (pnVar20->field_0xd8 != '\0')))) {
          if (((local_40->field_0xda & 2) != 0) ||
             (nVar14 = ngx_handle_read_event(local_40->read,(ulong)(uVar2 >> 8 & 1)), nVar14 == 0))
          {
            if (pnVar20 == (ngx_connection_t *)0x0) {
              return;
            }
            if (((pnVar20->field_0xda & 2) != 0) ||
               (nVar14 = ngx_handle_write_event(pnVar20->write,0), nVar14 == 0)) {
              if (((pnVar3->read->field_0x9 & 0x10) == 0) &&
                 ((pnVar19->read->field_0x9 & 0x10) == 0)) {
                ngx_event_add_timer(pnVar3->write,*(ngx_msec_t *)((long)pvVar5 + 8));
                return;
              }
              if ((pnVar3->write->field_0x9 & 8) == 0) {
                return;
              }
              ngx_event_del_timer(pnVar3->write);
              return;
            }
          }
          nVar21 = 500;
        }
        else {
          pnVar22 = pnVar3->log;
          p_Var10 = pnVar22->handler;
          pnVar22->handler = (ngx_log_handler_pt)0x0;
          if (6 < pnVar22->log_level) {
            pcVar24 = "";
            if (local_40->type == 2) {
              pcVar24 = "udp ";
            }
            pcVar25 = "client";
            if (from_upstream != 0) {
              pcVar25 = "upstream";
            }
            if (pnVar19 == (ngx_connection_t *)0x0) {
              oVar28 = 0;
            }
            else {
              oVar28 = pnVar19->sent;
            }
            ngx_log_error_core(7,pnVar22,0,
                               "%s%s disconnected, bytes from/to client:%O/%O, bytes from/to upstream:%O/%O"
                               ,pcVar24,pcVar25,s->received,pnVar3->sent,pnVar4->received,oVar28);
            pnVar22 = pnVar3->log;
          }
          pnVar22->handler = p_Var10;
          nVar21 = 200;
        }
        goto LAB_00188028;
      }
      uVar2 = *(uint *)&local_40->read->field_0x8;
      if ((uVar2 & 0x1220) != 0x20) goto LAB_00187e61;
      if (uVar6 != 0) {
        lVar26 = ((ngx_cached_time->sec - pnVar4->start_sec) + 1) * uVar6;
        sVar23 = lVar26 - *local_70;
        if (sVar23 == 0 || lVar26 < *local_70) {
          *(uint *)&local_40->read->field_0x8 = uVar2 | 0x1000;
          ngx_event_add_timer(local_40->read,(sVar23 * -1000) / uVar6 + 1);
          goto LAB_00187e61;
        }
        if ((long)sVar23 <= (long)sVar18) {
          sVar18 = sVar23;
        }
      }
      sVar15 = (*local_40->recv)(local_40,local_58->last,sVar18);
      if (sVar15 == -1) {
        if ((pnVar3->type == 2) && (pnVar4->received == 0)) {
LAB_00187fc5:
          ngx_stream_proxy_next_upstream(s);
          return;
        }
        puVar1 = &local_40->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
        sVar15 = 0;
      }
      else if ((sVar15 == -2) || (sVar15 < 0)) goto LAB_00187e61;
      if ((uVar6 != 0) && (uVar6 <= (ulong)(sVar15 * 1000))) {
        puVar1 = &local_40->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x1000;
        ngx_event_add_timer(local_40->read,(ulong)(sVar15 * 1000) / uVar6);
      }
      if ((from_upstream != 0) &&
         (pnVar7 = pnVar4->state, pnVar7->first_byte_time == 0xffffffffffffffff)) {
        pnVar7->first_byte_time = ngx_current_msec - pnVar7->response_time;
      }
      ppnVar12 = out;
      if ((pnVar3->type == 2) &&
         (nVar21 = pnVar4->responses + 1, pnVar4->responses = nVar21,
         nVar21 == *(ngx_uint_t *)((long)pvVar5 + 0x30))) {
        puVar1 = &local_40->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 & 0xffffffdf;
        puVar1 = &local_40->read->field_0x8;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x100;
      }
      do {
        ppnVar16 = ppnVar12;
        pnVar17 = *ppnVar16;
        ppnVar12 = &pnVar17->next;
      } while (pnVar17 != (ngx_chain_t *)0x0);
      pnVar17 = ngx_chain_get_free_buf(pnVar3->pool,&pnVar4->free);
      if (pnVar17 == (ngx_chain_t *)0x0) goto LAB_00187e31;
      *ppnVar16 = pnVar17;
      puVar8 = local_58->last;
      pnVar9 = pnVar17->buf;
      pnVar9->pos = puVar8;
      pnVar9->last = puVar8 + sVar15;
      pnVar9->tag = &ngx_stream_proxy_module;
      *(ushort *)&pnVar9->field_0x48 =
           (ushort)*(undefined4 *)&pnVar9->field_0x48 & 0xfffe | (ushort)(sVar15 != 0);
      *(ushort *)&pnVar17->buf->field_0x48 =
           (ushort)*(undefined4 *)&pnVar17->buf->field_0x48 & 0xff7f |
           *(ushort *)&local_40->read->field_0x8 >> 1 & 0x80;
      puVar1 = &pnVar17->buf->field_0x48;
      *(ushort *)puVar1 = *(ushort *)puVar1 | 0x20;
      *local_70 = *local_70 + sVar15;
      local_58->last = local_58->last + sVar15;
      bVar11 = pnVar20 != (ngx_connection_t *)0x0;
    } while( true );
  }
  pnVar22 = pnVar3->log;
  p_Var10 = pnVar22->handler;
  pnVar22->handler = (ngx_log_handler_pt)0x0;
  if (6 < pnVar22->log_level) {
    ngx_log_error_core(7,pnVar22,0,"disconnected on shutdown");
    pnVar22 = pnVar3->log;
  }
  pnVar22->handler = p_Var10;
  nVar21 = 200;
LAB_00188028:
  ngx_stream_proxy_finalize(s,nVar21);
  return;
LAB_00187e31:
  nVar21 = 500;
  goto LAB_00188028;
}

Assistant:

static void
ngx_stream_proxy_process(ngx_stream_session_t *s, ngx_uint_t from_upstream,
    ngx_uint_t do_write)
{
    off_t                        *received, limit;
    size_t                        size, limit_rate;
    ssize_t                       n;
    ngx_buf_t                    *b;
    ngx_int_t                     rc;
    ngx_uint_t                    flags;
    ngx_msec_t                    delay;
    ngx_chain_t                  *cl, **ll, **out, **busy;
    ngx_connection_t             *c, *pc, *src, *dst;
    ngx_log_handler_pt            handler;
    ngx_stream_upstream_t        *u;
    ngx_stream_proxy_srv_conf_t  *pscf;

    u = s->upstream;

    c = s->connection;
    pc = u->connected ? u->peer.connection : NULL;

    if (c->type == SOCK_DGRAM && (ngx_terminate || ngx_exiting)) {

        /* socket is already closed on worker shutdown */

        handler = c->log->handler;
        c->log->handler = NULL;

        ngx_log_error(NGX_LOG_INFO, c->log, 0, "disconnected on shutdown");

        c->log->handler = handler;

        ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
        return;
    }

    pscf = ngx_stream_get_module_srv_conf(s, ngx_stream_proxy_module);

    if (from_upstream) {
        src = pc;
        dst = c;
        b = &u->upstream_buf;
        limit_rate = pscf->download_rate;
        received = &u->received;
        out = &u->downstream_out;
        busy = &u->downstream_busy;

    } else {
        src = c;
        dst = pc;
        b = &u->downstream_buf;
        limit_rate = pscf->upload_rate;
        received = &s->received;
        out = &u->upstream_out;
        busy = &u->upstream_busy;
    }

    for ( ;; ) {

        if (do_write && dst) {

            if (*out || *busy || dst->buffered) {
                rc = ngx_stream_top_filter(s, *out, from_upstream);

                if (rc == NGX_ERROR) {
                    if (c->type == SOCK_DGRAM && !from_upstream) {
                        ngx_stream_proxy_next_upstream(s);
                        return;
                    }

                    ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
                    return;
                }

                ngx_chain_update_chains(c->pool, &u->free, busy, out,
                                      (ngx_buf_tag_t) &ngx_stream_proxy_module);

                if (*busy == NULL) {
                    b->pos = b->start;
                    b->last = b->start;
                }
            }
        }

        size = b->end - b->last;

        if (size && src->read->ready && !src->read->delayed
            && !src->read->error)
        {
            if (limit_rate) {
                limit = (off_t) limit_rate * (ngx_time() - u->start_sec + 1)
                        - *received;

                if (limit <= 0) {
                    src->read->delayed = 1;
                    delay = (ngx_msec_t) (- limit * 1000 / limit_rate + 1);
                    ngx_add_timer(src->read, delay);
                    break;
                }

                if ((off_t) size > limit) {
                    size = (size_t) limit;
                }
            }

            n = src->recv(src, b->last, size);

            if (n == NGX_AGAIN) {
                break;
            }

            if (n == NGX_ERROR) {
                if (c->type == SOCK_DGRAM && u->received == 0) {
                    ngx_stream_proxy_next_upstream(s);
                    return;
                }

                src->read->eof = 1;
                n = 0;
            }

            if (n >= 0) {
                if (limit_rate) {
                    delay = (ngx_msec_t) (n * 1000 / limit_rate);

                    if (delay > 0) {
                        src->read->delayed = 1;
                        ngx_add_timer(src->read, delay);
                    }
                }

                if (from_upstream) {
                    if (u->state->first_byte_time == (ngx_msec_t) -1) {
                        u->state->first_byte_time = ngx_current_msec
                                                    - u->state->response_time;
                    }
                }

                if (c->type == SOCK_DGRAM && ++u->responses == pscf->responses)
                {
                    src->read->ready = 0;
                    src->read->eof = 1;
                }

                for (ll = out; *ll; ll = &(*ll)->next) { /* void */ }

                cl = ngx_chain_get_free_buf(c->pool, &u->free);
                if (cl == NULL) {
                    ngx_stream_proxy_finalize(s,
                                              NGX_STREAM_INTERNAL_SERVER_ERROR);
                    return;
                }

                *ll = cl;

                cl->buf->pos = b->last;
                cl->buf->last = b->last + n;
                cl->buf->tag = (ngx_buf_tag_t) &ngx_stream_proxy_module;

                cl->buf->temporary = (n ? 1 : 0);
                cl->buf->last_buf = src->read->eof;
                cl->buf->flush = 1;

                *received += n;
                b->last += n;
                do_write = 1;

                continue;
            }
        }

        break;
    }

    if (src->read->eof && dst && (dst->read->eof || !dst->buffered)) {
        handler = c->log->handler;
        c->log->handler = NULL;

        ngx_log_error(NGX_LOG_INFO, c->log, 0,
                      "%s%s disconnected"
                      ", bytes from/to client:%O/%O"
                      ", bytes from/to upstream:%O/%O",
                      src->type == SOCK_DGRAM ? "udp " : "",
                      from_upstream ? "upstream" : "client",
                      s->received, c->sent, u->received, pc ? pc->sent : 0);

        c->log->handler = handler;

        ngx_stream_proxy_finalize(s, NGX_STREAM_OK);
        return;
    }

    flags = src->read->eof ? NGX_CLOSE_EVENT : 0;

    if (!src->shared && ngx_handle_read_event(src->read, flags) != NGX_OK) {
        ngx_stream_proxy_finalize(s, NGX_STREAM_INTERNAL_SERVER_ERROR);
        return;
    }

    if (dst) {
        if (!dst->shared && ngx_handle_write_event(dst->write, 0) != NGX_OK) {
            ngx_stream_proxy_finalize(s, NGX_STREAM_INTERNAL_SERVER_ERROR);
            return;
        }

        if (!c->read->delayed && !pc->read->delayed) {
            ngx_add_timer(c->write, pscf->timeout);

        } else if (c->write->timer_set) {
            ngx_del_timer(c->write);
        }
    }
}